

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O3

void __thiscall
Gluco::OccLists<Gluco::Lit,_Gluco::vec<Gluco::Solver::Watcher>,_Gluco::Solver::WatcherDeleted>::
clean(OccLists<Gluco::Lit,_Gluco::vec<Gluco::Solver::Watcher>,_Gluco::Solver::WatcherDeleted> *this,
     Lit *idx)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  vec<Gluco::Solver::Watcher> *pvVar6;
  long lVar7;
  long lVar8;
  
  pvVar6 = (this->occs).data;
  iVar5 = pvVar6[idx->x].sz;
  if (iVar5 < 1) {
    if (iVar5 < 0) goto LAB_005c6239;
  }
  else {
    pvVar6 = pvVar6 + idx->x;
    lVar8 = 0;
    lVar7 = 0;
    iVar5 = 0;
    do {
      bVar2 = Solver::WatcherDeleted::operator()
                        (&this->deleted,(Watcher *)((long)&pvVar6->data->cref + lVar8));
      if (!bVar2) {
        lVar4 = (long)iVar5;
        iVar5 = iVar5 + 1;
        pvVar6->data[lVar4] = *(Watcher *)((long)&pvVar6->data->cref + lVar8);
      }
      lVar7 = lVar7 + 1;
      iVar1 = pvVar6->sz;
      lVar8 = lVar8 + 8;
    } while (lVar7 < iVar1);
    iVar3 = (int)lVar7 - iVar5;
    if (iVar1 < iVar3) {
LAB_005c6239:
      __assert_fail("nelems <= sz",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/Vec.h"
                    ,0x42,
                    "void Gluco::vec<Gluco::Solver::Watcher>::shrink(int) [T = Gluco::Solver::Watcher]"
                   );
    }
    if (0 < iVar3) {
      pvVar6->sz = (iVar5 + iVar1) - (int)lVar7;
    }
  }
  (this->dirty).data[idx->x] = '\0';
  return;
}

Assistant:

void OccLists<Idx,Vec,Deleted>::clean(const Idx& idx)
{
    Vec& vec = occs[toInt(idx)];
    int  i, j;
    for (i = j = 0; i < vec.size(); i++)
        if (!deleted(vec[i]))
            vec[j++] = vec[i];
    vec.shrink(i - j);
    dirty[toInt(idx)] = 0;
}